

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

void readString(bool raw)

{
  char cVar1;
  LexerState *pLVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  char v;
  ulong uVar8;
  
  pLVar2 = lexerState;
  pLVar2->disableMacroArgs = true;
  pLVar2->disableInterpolation = true;
  iVar3 = peek();
  if (iVar3 == 0x22) {
    shiftChar();
    iVar4 = peek();
    if (iVar4 != 0x22) {
      uVar8 = 0;
      goto LAB_0010e719;
    }
    shiftChar();
  }
  iVar4 = peek();
  if (iVar4 == -1) {
    uVar8 = 0;
LAB_0010e6e4:
    error("Unterminated string\n");
LAB_0010e6f2:
    if (uVar8 == 0x100) {
      warning(WARNING_LONG_STR,"String constant too long\n");
      uVar8 = 0xff;
    }
LAB_0010e719:
    yylval.symName[uVar8] = '\0';
    pLVar2 = lexerState;
    pLVar2->disableMacroArgs = false;
    pLVar2->disableInterpolation = false;
    return;
  }
  uVar8 = 0;
LAB_0010e465:
  if ((iVar3 != 0x22) && ((iVar4 == 0xd || (iVar4 == 10)))) goto LAB_0010e6e4;
  shiftChar();
  if (iVar4 < 0x22) {
    if (iVar4 != 10) {
      if (iVar4 != 0xd) goto LAB_0010e52f;
      iVar4 = peek();
      if (iVar4 == 10) {
        shiftChar();
      }
    }
    pLVar2 = lexerState;
    lexerState->lineNo = lexerState->lineNo + 1;
    pLVar2->colNo = 1;
LAB_0010e529:
    iVar4 = 10;
  }
  else {
    if (iVar4 != 0x22) {
      if (iVar4 == 0x5c) {
        iVar4 = 0x5c;
        if (!raw) {
          iVar4 = peek();
          if (iVar4 < 0x30) {
            if (iVar4 < 0x20) {
              if (iVar4 == -1) {
                error("Illegal character escape at end of input\n");
                iVar4 = 0x5c;
                goto LAB_0010e52f;
              }
              if ((iVar4 == 10) || (iVar4 == 0xd)) goto LAB_0010e667;
            }
            else {
              if (iVar4 == 0x20) {
LAB_0010e667:
                readLineContinuation();
                goto LAB_0010e53f;
              }
              if (iVar4 == 0x22) goto LAB_0010e6d7;
              if (iVar4 == 0x23) goto LAB_0010e5ca;
            }
LAB_0010e6be:
            pcVar6 = printChar(iVar4);
            error("Illegal character escape %s\n",pcVar6);
          }
          else {
            if (iVar4 < 0x72) {
              uVar7 = (ulong)(iVar4 - 0x30U);
              if (0x3e < iVar4 - 0x30U) goto LAB_0010e6be;
              if ((0x113ffUL >> (uVar7 & 0x3f) & 1) != 0) {
LAB_0010e5ca:
                shiftChar();
                pcVar6 = readMacroArg((char)iVar4);
                if (pcVar6 != (char *)0x0) {
                  cVar1 = *pcVar6;
                  while (cVar1 != '\0') {
                    pcVar6 = pcVar6 + 1;
                    if (uVar8 < 0x100) {
                      yylval.symName[uVar8] = cVar1;
                      uVar8 = uVar8 + 1;
                    }
                    cVar1 = *pcVar6;
                  }
                }
                goto LAB_0010e53f;
              }
              if (uVar7 == 0x2c) goto LAB_0010e6d7;
              if (uVar7 != 0x3e) goto LAB_0010e6be;
              shiftChar();
              goto LAB_0010e529;
            }
            if (iVar4 < 0x7b) {
              if (iVar4 == 0x72) {
                shiftChar();
                iVar4 = 0xd;
              }
              else {
                if (iVar4 != 0x74) goto LAB_0010e6be;
                shiftChar();
                iVar4 = 9;
              }
              goto LAB_0010e52f;
            }
            if ((iVar4 != 0x7d) && (iVar4 != 0x7b)) goto LAB_0010e6be;
          }
LAB_0010e6d7:
          shiftChar();
        }
        goto LAB_0010e52f;
      }
      if ((iVar4 != 0x7b) || (iVar4 = 0x7b, raw)) goto LAB_0010e52f;
      lexerState->disableMacroArgs = false;
      pcVar6 = readInterpolation(0);
      if (pcVar6 != (char *)0x0) {
        cVar1 = *pcVar6;
        while (cVar1 != '\0') {
          pcVar6 = pcVar6 + 1;
          if (uVar8 < 0x100) {
            yylval.symName[uVar8] = cVar1;
            uVar8 = uVar8 + 1;
          }
          cVar1 = *pcVar6;
        }
      }
      lexerState->disableMacroArgs = true;
      goto LAB_0010e53f;
    }
    if (iVar3 != 0x22) goto LAB_0010e6f2;
    iVar5 = peek();
    iVar4 = 0x22;
    if (iVar5 == 0x22) {
      shiftChar();
      iVar5 = peek();
      if (iVar5 != 0x22) {
        if (0xff < uVar8) goto LAB_0010e53f;
        yylval.symName[uVar8] = '\"';
        uVar8 = uVar8 + 1;
        goto LAB_0010e52f;
      }
      shiftChar();
      goto LAB_0010e6f2;
    }
  }
LAB_0010e52f:
  if (uVar8 < 0x100) {
    yylval.symName[uVar8] = (char)iVar4;
    uVar8 = uVar8 + 1;
  }
LAB_0010e53f:
  iVar4 = peek();
  if (iVar4 == -1) goto LAB_0010e6e4;
  goto LAB_0010e465;
}

Assistant:

static void readString(bool raw)
{
	lexerState->disableMacroArgs = true;
	lexerState->disableInterpolation = true;

	size_t i = 0;
	bool multiline = false;
	char const *str;

	// We reach this function after reading a single quote, but we also support triple quotes
	if (peek() == '"') {
		shiftChar();
		if (peek() == '"') {
			// """ begins a multi-line string
			shiftChar();
			multiline = true;
		} else {
			// "" is an empty string, skip the loop
			goto finish;
		}
	}

	for (;;) {
		int c = peek();

		// '\r', '\n' or EOF ends a single-line string early
		if (c == EOF || (!multiline && (c == '\r' || c == '\n'))) {
			error("Unterminated string\n");
			break;
		}

		// We'll be staying in the string, so we can safely consume the char
		shiftChar();

		// Handle '\r' or '\n' (in multiline strings only, already handled above otherwise)
		if (c == '\r' || c == '\n') {
			// Handle CRLF before nextLine() since shiftChar updates colNo
			handleCRLF(c);
			nextLine();
			c = '\n';
		}

		switch (c) {
		case '"':
			if (multiline) {
				// Only """ ends a multi-line string
				if (peek() != '"')
					break;
				shiftChar();
				if (peek() != '"') {
					append_yylval_string('"');
					break;
				}
				shiftChar();
			}
			goto finish;

		case '\\': // Character escape or macro arg
			if (raw)
				break;
			c = peek();
			switch (c) {
			case '\\':
			case '"':
			case '{':
			case '}':
				// Return that character unchanged
				shiftChar();
				break;
			case 'n':
				c = '\n';
				shiftChar();
				break;
			case 'r':
				c = '\r';
				shiftChar();
				break;
			case 't':
				c = '\t';
				shiftChar();
				break;

			// Line continuation
			case ' ':
			case '\r':
			case '\n':
				readLineContinuation();
				continue;

			// Macro arg
			case '@':
			case '#':
			case '0':
			case '1':
			case '2':
			case '3':
			case '4':
			case '5':
			case '6':
			case '7':
			case '8':
			case '9':
			case '<':
				shiftChar();
				str = readMacroArg(c);
				if (str) {
					while (*str)
						append_yylval_string(*str++);
				}
				continue; // Do not copy an additional character

			case EOF: // Can't really print that one
				error("Illegal character escape at end of input\n");
				c = '\\';
				break;

			default:
				error("Illegal character escape %s\n", printChar(c));
				shiftChar();
				break;
			}
			break;

		case '{': // Symbol interpolation
			if (raw)
				break;
			// We'll be exiting the string scope, so re-enable expansions
			// (Not interpolations, since they're handled by the function itself...)
			lexerState->disableMacroArgs = false;
			str = readInterpolation(0);
			if (str) {
				while (*str)
					append_yylval_string(*str++);
			}
			lexerState->disableMacroArgs = true;
			continue; // Do not copy an additional character

		// Regular characters will just get copied
		}

		append_yylval_string(c);
	}

finish:
	if (i == sizeof(yylval.string)) {
		i--;
		warning(WARNING_LONG_STR, "String constant too long\n");
	}
	yylval.string[i] = '\0';

	lexerState->disableMacroArgs = false;
	lexerState->disableInterpolation = false;
}